

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall curlpp::LibcurlLogicError::~LibcurlLogicError(LibcurlLogicError *this)

{
  void *in_RDI;
  
  ~LibcurlLogicError((LibcurlLogicError *)0x1484e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

class CURLPPAPI LibcurlLogicError : public curlpp::LogicError
	{

	public:

		LibcurlLogicError(const std::string & reason, CURLcode code);
		LibcurlLogicError(const char * reason, CURLcode code);

		/* 
		* return the CURLcode that libcurl returned
		*/
		CURLcode whatCode() const throw();

	private:

		CURLcode mCode;

	}